

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_write.h
# Opt level: O1

uchar * stbi_write_png_to_mem(uchar *pixels,int stride_bytes,int x,int y,int n,int *out_len)

{
  undefined4 uVar1;
  bool bVar2;
  undefined8 uVar3;
  byte bVar4;
  byte bVar5;
  int *piVar6;
  uchar *puVar7;
  uchar uVar8;
  uchar *puVar9;
  char *line_buffer;
  ulong uVar10;
  uchar *__src;
  int iVar11;
  int data_len;
  int filter_type;
  int iVar12;
  size_t __n;
  uint uVar13;
  ulong uVar14;
  int filter_type_00;
  ushort uVar15;
  undefined1 auVar17 [16];
  undefined1 auVar18 [32];
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  undefined1 auVar22 [64];
  undefined1 auVar23 [64];
  int iVar24;
  undefined1 auVar25 [64];
  int zlen;
  ulong local_b8;
  uchar *local_b0;
  int *local_a8;
  uchar *local_a0;
  ulong local_98;
  long local_90;
  size_t local_88;
  uchar *local_80;
  undefined1 local_78 [64];
  undefined1 auVar16 [16];
  
  uVar13 = n * x;
  if (stride_bytes == 0) {
    stride_bytes = uVar13;
  }
  iVar11 = -1;
  if (stbi_write_force_png_filter < 5) {
    iVar11 = stbi_write_force_png_filter;
  }
  data_len = (uVar13 + 1) * y;
  local_b0 = pixels;
  puVar9 = (uchar *)malloc((long)data_len);
  if (puVar9 != (uchar *)0x0) {
    local_88 = (size_t)(int)uVar13;
    line_buffer = (char *)malloc(local_88);
    if (line_buffer == (char *)0x0) {
      free(puVar9);
    }
    else {
      local_b8 = (ulong)uVar13;
      local_a8 = out_len;
      if (0 < y) {
        local_90 = (long)(int)(uVar13 + 1);
        local_98 = (ulong)(uint)y;
        auVar19 = vpbroadcastq_avx512f();
        local_78 = vmovdqu64_avx512f(auVar19);
        uVar14 = 0;
        local_a0 = puVar9;
        do {
          filter_type = iVar11;
          if (iVar11 < 0) {
            filter_type = 0;
            iVar12 = 0x7fffffff;
            filter_type_00 = 0;
            do {
              stbiw__encode_png_line
                        (local_b0,stride_bytes,x,y,(int)uVar14,n,filter_type_00,line_buffer);
              iVar24 = 0;
              auVar19 = vmovdqu64_avx512f(local_78);
              auVar20 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
              auVar21 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
              if (0 < (int)local_b8) {
                auVar25 = ZEXT1664((undefined1  [16])0x0);
                uVar10 = 0;
                do {
                  auVar22 = vmovdqa64_avx512f(auVar25);
                  auVar25 = vpbroadcastq_avx512f();
                  auVar23 = vporq_avx512f(auVar25,auVar20);
                  auVar25 = vporq_avx512f(auVar25,auVar21);
                  uVar3 = vpcmpuq_avx512f(auVar25,auVar19,2);
                  bVar4 = (byte)uVar3;
                  uVar3 = vpcmpuq_avx512f(auVar23,auVar19,2);
                  bVar5 = (byte)uVar3;
                  uVar15 = CONCAT11(bVar5,bVar4);
                  auVar16 = vmovdqu8_avx512vl(*(undefined1 (*) [16])(line_buffer + uVar10));
                  auVar17[1] = ((byte)(uVar15 >> 1) & 1) * auVar16[1];
                  auVar17[0] = (bVar4 & 1) * auVar16[0];
                  auVar17[2] = ((byte)(uVar15 >> 2) & 1) * auVar16[2];
                  auVar17[3] = ((byte)(uVar15 >> 3) & 1) * auVar16[3];
                  auVar17[4] = ((byte)(uVar15 >> 4) & 1) * auVar16[4];
                  auVar17[5] = ((byte)(uVar15 >> 5) & 1) * auVar16[5];
                  auVar17[6] = ((byte)(uVar15 >> 6) & 1) * auVar16[6];
                  auVar17[7] = ((byte)(uVar15 >> 7) & 1) * auVar16[7];
                  auVar17[8] = (bVar5 & 1) * auVar16[8];
                  auVar17[9] = (bVar5 >> 1 & 1) * auVar16[9];
                  auVar17[10] = (bVar5 >> 2 & 1) * auVar16[10];
                  auVar17[0xb] = (bVar5 >> 3 & 1) * auVar16[0xb];
                  auVar17[0xc] = (bVar5 >> 4 & 1) * auVar16[0xc];
                  auVar17[0xd] = (bVar5 >> 5 & 1) * auVar16[0xd];
                  auVar17[0xe] = (bVar5 >> 6 & 1) * auVar16[0xe];
                  auVar17[0xf] = -((char)bVar5 >> 7) * auVar16[0xf];
                  auVar16 = vpabsb_avx(auVar17);
                  auVar25 = vpmovzxbd_avx512f(auVar16);
                  auVar25 = vpaddd_avx512f(auVar22,auVar25);
                  uVar10 = uVar10 + 0x10;
                } while ((uVar13 + 0xf & 0xfffffff0) != uVar10);
                auVar19 = vmovdqa32_avx512f(auVar25);
                auVar20._0_4_ =
                     (uint)(bVar4 & 1) * auVar19._0_4_ | (uint)!(bool)(bVar4 & 1) * auVar22._0_4_;
                bVar2 = (bool)((byte)(uVar15 >> 1) & 1);
                auVar20._4_4_ = (uint)bVar2 * auVar19._4_4_ | (uint)!bVar2 * auVar22._4_4_;
                bVar2 = (bool)((byte)(uVar15 >> 2) & 1);
                auVar20._8_4_ = (uint)bVar2 * auVar19._8_4_ | (uint)!bVar2 * auVar22._8_4_;
                bVar2 = (bool)((byte)(uVar15 >> 3) & 1);
                auVar20._12_4_ = (uint)bVar2 * auVar19._12_4_ | (uint)!bVar2 * auVar22._12_4_;
                bVar2 = (bool)((byte)(uVar15 >> 4) & 1);
                auVar20._16_4_ = (uint)bVar2 * auVar19._16_4_ | (uint)!bVar2 * auVar22._16_4_;
                bVar2 = (bool)((byte)(uVar15 >> 5) & 1);
                auVar20._20_4_ = (uint)bVar2 * auVar19._20_4_ | (uint)!bVar2 * auVar22._20_4_;
                bVar2 = (bool)((byte)(uVar15 >> 6) & 1);
                auVar20._24_4_ = (uint)bVar2 * auVar19._24_4_ | (uint)!bVar2 * auVar22._24_4_;
                bVar2 = (bool)((byte)(uVar15 >> 7) & 1);
                auVar20._28_4_ = (uint)bVar2 * auVar19._28_4_ | (uint)!bVar2 * auVar22._28_4_;
                auVar20._32_4_ =
                     (uint)(bVar5 & 1) * auVar19._32_4_ | (uint)!(bool)(bVar5 & 1) * auVar22._32_4_;
                bVar2 = (bool)(bVar5 >> 1 & 1);
                auVar20._36_4_ = (uint)bVar2 * auVar19._36_4_ | (uint)!bVar2 * auVar22._36_4_;
                bVar2 = (bool)(bVar5 >> 2 & 1);
                auVar20._40_4_ = (uint)bVar2 * auVar19._40_4_ | (uint)!bVar2 * auVar22._40_4_;
                bVar2 = (bool)(bVar5 >> 3 & 1);
                auVar20._44_4_ = (uint)bVar2 * auVar19._44_4_ | (uint)!bVar2 * auVar22._44_4_;
                bVar2 = (bool)(bVar5 >> 4 & 1);
                auVar20._48_4_ = (uint)bVar2 * auVar19._48_4_ | (uint)!bVar2 * auVar22._48_4_;
                bVar2 = (bool)(bVar5 >> 5 & 1);
                auVar20._52_4_ = (uint)bVar2 * auVar19._52_4_ | (uint)!bVar2 * auVar22._52_4_;
                bVar2 = (bool)(bVar5 >> 6 & 1);
                auVar20._56_4_ = (uint)bVar2 * auVar19._56_4_ | (uint)!bVar2 * auVar22._56_4_;
                auVar20._60_4_ =
                     (uint)(bVar5 >> 7) * auVar19._60_4_ |
                     (uint)!(bool)(bVar5 >> 7) * auVar22._60_4_;
                auVar18 = vextracti64x4_avx512f(auVar20,1);
                auVar19 = vpaddd_avx512f(auVar20,ZEXT3264(auVar18));
                auVar16 = vpaddd_avx(auVar19._0_16_,auVar19._16_16_);
                auVar17 = vpshufd_avx(auVar16,0xee);
                auVar16 = vpaddd_avx(auVar16,auVar17);
                auVar17 = vpshufd_avx(auVar16,0x55);
                auVar16 = vpaddd_avx(auVar16,auVar17);
                iVar24 = auVar16._0_4_;
              }
              if (iVar24 < iVar12) {
                iVar12 = iVar24;
                filter_type = filter_type_00;
              }
              filter_type_00 = filter_type_00 + 1;
            } while (filter_type_00 != 5);
            uVar8 = '\x05';
            puVar9 = local_a0;
            if (filter_type != 5) goto LAB_00163b1f;
          }
          else {
LAB_00163b1f:
            stbiw__encode_png_line(local_b0,stride_bytes,x,y,(int)uVar14,n,filter_type,line_buffer);
            uVar8 = (uchar)filter_type;
          }
          puVar9[uVar14 * local_90] = uVar8;
          memcpy(puVar9 + uVar14 * local_90 + 1,line_buffer,local_88);
          uVar14 = uVar14 + 1;
        } while (uVar14 != local_98);
      }
      free(line_buffer);
      __src = stbi_zlib_compress(puVar9,data_len,&zlen,stbi_write_png_compression_level);
      free(puVar9);
      if (__src != (uchar *)0x0) {
        __n = (size_t)zlen;
        puVar9 = (uchar *)malloc(__n + 0x39);
        piVar6 = local_a8;
        if (puVar9 != (uchar *)0x0) {
          *local_a8 = (int)(__n + 0x39);
          puVar9[0] = 0x89;
          puVar9[1] = 'P';
          puVar9[2] = 'N';
          puVar9[3] = 'G';
          puVar9[4] = '\r';
          puVar9[5] = '\n';
          puVar9[6] = '\x1a';
          puVar9[7] = '\n';
          puVar9[8] = '\0';
          puVar9[9] = '\0';
          puVar9[10] = '\0';
          puVar9[0xb] = '\r';
          puVar9[0xc] = 'I';
          puVar9[0xd] = 'H';
          puVar9[0xe] = 'D';
          puVar9[0xf] = 'R';
          puVar9[0x10] = (uchar)((uint)x >> 0x18);
          puVar9[0x11] = (uchar)((uint)x >> 0x10);
          puVar9[0x12] = (uchar)((uint)x >> 8);
          puVar9[0x13] = (uchar)x;
          puVar9[0x14] = (uchar)((uint)y >> 0x18);
          puVar9[0x15] = (uchar)((uint)y >> 0x10);
          puVar9[0x16] = (uchar)((uint)y >> 8);
          puVar9[0x17] = (uchar)y;
          puVar9[0x18] = '\b';
          puVar9[0x19] = (&DAT_001c9fc0)[(long)n * 4];
          puVar9[0x1a] = '\0';
          puVar9[0x1b] = '\0';
          local_80 = puVar9 + 0x1d;
          puVar9[0x1c] = '\0';
          stbiw__wpcrc(&local_80,0xd);
          puVar7 = local_80;
          uVar1 = swap_bytes(zlen);
          *(undefined4 *)local_80 = uVar1;
          local_80[4] = 'I';
          local_80[5] = 'D';
          local_80[6] = 'A';
          local_80[7] = 'T';
          local_80 = local_80 + 8;
          memmove(local_80,__src,__n);
          local_80 = puVar7 + __n + 8;
          free(__src);
          stbiw__wpcrc(&local_80,zlen);
          local_80[0] = '\0';
          local_80[1] = '\0';
          local_80[2] = '\0';
          local_80[3] = '\0';
          local_80[4] = 'I';
          local_80[5] = 'E';
          local_80[6] = 'N';
          local_80[7] = 'D';
          local_80 = local_80 + 8;
          stbiw__wpcrc(&local_80,0);
          if (local_80 == puVar9 + *piVar6) {
            return puVar9;
          }
          __assert_fail("o == out + *out_len",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/fjzzq2002[P]MiniShader/stb_image_write.h"
                        ,0x483,
                        "unsigned char *stbi_write_png_to_mem(const unsigned char *, int, int, int, int, int *)"
                       );
        }
      }
    }
  }
  return (uchar *)0x0;
}

Assistant:

STBIWDEF unsigned char *stbi_write_png_to_mem(const unsigned char *pixels, int stride_bytes, int x, int y, int n, int *out_len)
{
   int force_filter = stbi_write_force_png_filter;
   int ctype[5] = { -1, 0, 4, 2, 6 };
   unsigned char sig[8] = { 137,80,78,71,13,10,26,10 };
   unsigned char *out,*o, *filt, *zlib;
   signed char *line_buffer;
   int j,zlen;

   if (stride_bytes == 0)
      stride_bytes = x * n;

   if (force_filter >= 5) {
      force_filter = -1;
   }

   filt = (unsigned char *) STBIW_MALLOC((x*n+1) * y); if (!filt) return 0;
   line_buffer = (signed char *) STBIW_MALLOC(x * n); if (!line_buffer) { STBIW_FREE(filt); return 0; }
   for (j=0; j < y; ++j) {
      int filter_type;
      if (force_filter > -1) {
         filter_type = force_filter;
         stbiw__encode_png_line((unsigned char*)(pixels), stride_bytes, x, y, j, n, force_filter, line_buffer);
      } else { // Estimate the best filter by running through all of them:
         int best_filter = 0, best_filter_val = 0x7fffffff, est, i;
         for (filter_type = 0; filter_type < 5; filter_type++) {
            stbiw__encode_png_line((unsigned char*)(pixels), stride_bytes, x, y, j, n, filter_type, line_buffer);

            // Estimate the entropy of the line using this filter; the less, the better.
            est = 0;
            for (i = 0; i < x*n; ++i) {
               est += abs((signed char) line_buffer[i]);
            }
            if (est < best_filter_val) {
               best_filter_val = est;
               best_filter = filter_type;
            }
         }
         if (filter_type != best_filter) {  // If the last iteration already got us the best filter, don't redo it
            stbiw__encode_png_line((unsigned char*)(pixels), stride_bytes, x, y, j, n, best_filter, line_buffer);
            filter_type = best_filter;
         }
      }
      // when we get here, filter_type contains the filter type, and line_buffer contains the data
      filt[j*(x*n+1)] = (unsigned char) filter_type;
      STBIW_MEMMOVE(filt+j*(x*n+1)+1, line_buffer, x*n);
   }
   STBIW_FREE(line_buffer);
   zlib = stbi_zlib_compress(filt, y*( x*n+1), &zlen, stbi_write_png_compression_level);
   STBIW_FREE(filt);
   if (!zlib) return 0;

   // each tag requires 12 bytes of overhead
   out = (unsigned char *) STBIW_MALLOC(8 + 12+13 + 12+zlen + 12);
   if (!out) return 0;
   *out_len = 8 + 12+13 + 12+zlen + 12;

   o=out;
   STBIW_MEMMOVE(o,sig,8); o+= 8;
   stbiw__wp32(o, 13); // header length
   stbiw__wptag(o, "IHDR");
   stbiw__wp32(o, x);
   stbiw__wp32(o, y);
   *o++ = 8;
   *o++ = STBIW_UCHAR(ctype[n]);
   *o++ = 0;
   *o++ = 0;
   *o++ = 0;
   stbiw__wpcrc(&o,13);

   stbiw__wp32(o, zlen);
   stbiw__wptag(o, "IDAT");
   STBIW_MEMMOVE(o, zlib, zlen);
   o += zlen;
   STBIW_FREE(zlib);
   stbiw__wpcrc(&o, zlen);

   stbiw__wp32(o,0);
   stbiw__wptag(o, "IEND");
   stbiw__wpcrc(&o,0);

   STBIW_ASSERT(o == out + *out_len);

   return out;
}